

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::APFloat::print(APFloat *this,raw_ostream *OS)

{
  raw_ostream *this_00;
  undefined1 local_38 [8];
  SmallVector<char,_16U> Buffer;
  raw_ostream *OS_local;
  APFloat *this_local;
  
  Buffer.super_SmallVectorStorage<char,_16U>.InlineElts._8_8_ = OS;
  SmallVector<char,_16U>::SmallVector((SmallVector<char,_16U> *)local_38);
  toString(this,(SmallVectorImpl<char> *)local_38,0,3,true);
  this_00 = raw_ostream::operator<<
                      ((raw_ostream *)Buffer.super_SmallVectorStorage<char,_16U>.InlineElts._8_8_,
                       (SmallVectorImpl<char> *)local_38);
  raw_ostream::operator<<(this_00,"\n");
  SmallVector<char,_16U>::~SmallVector((SmallVector<char,_16U> *)local_38);
  return;
}

Assistant:

void APFloat::print(raw_ostream &OS) const {
  SmallVector<char, 16> Buffer;
  toString(Buffer);
  OS << Buffer << "\n";
}